

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O2

DdNode * cuddBddClosestCube(DdManager *dd,DdNode *f,DdNode *g,double bound)

{
  int *piVar1;
  DdNode *pDVar2;
  uint *puVar3;
  DdNode *pDVar4;
  DdNode *g_00;
  DdNode *f_00;
  DdNode *n;
  DdNode *f_01;
  DdNode *n_00;
  DdNode *f_02;
  uint uVar5;
  DdNode *g_01;
  uint index;
  uint uVar6;
  uint uVar7;
  uint *puVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  DdNode *local_c0;
  double local_50;
  double local_48;
  double dee;
  double dtt;
  
  if ((DdNode *)((ulong)g ^ 1) == f) {
    dVar9 = 1.0;
  }
  else {
    dVar9 = 0.0;
  }
  pDVar2 = dd->zero;
  if (bound < dVar9) {
    return pDVar2;
  }
  pDVar4 = dd->one;
  if ((DdNode *)((ulong)pDVar4 ^ 1) == f || (DdNode *)((ulong)pDVar4 ^ 1) == g) {
    return pDVar2;
  }
  if (pDVar4 == g && pDVar4 == f) {
    return pDVar4;
  }
  puVar3 = (uint *)((ulong)f & 0xfffffffffffffffe);
  puVar8 = (uint *)((ulong)g & 0xfffffffffffffffe);
  if (((puVar3[1] != 1) || (puVar8[1] != 1)) &&
     (pDVar4 = cuddCacheLookup2(dd,Cudd_bddClosestCube,f,g), pDVar4 != (DdNode *)0x0)) {
    return pDVar4;
  }
  uVar5 = *puVar3;
  uVar6 = 0x7fffffff;
  uVar7 = 0x7fffffff;
  if ((ulong)uVar5 != 0x7fffffff) {
    uVar7 = dd->perm[uVar5];
  }
  index = *puVar8;
  if ((ulong)index != 0x7fffffff) {
    uVar6 = dd->perm[index];
  }
  f_02 = f;
  pDVar4 = f;
  if (uVar7 <= uVar6) {
    pDVar4 = *(DdNode **)(puVar3 + 4);
    f_02 = *(DdNode **)(puVar3 + 6);
    index = uVar5;
    if (((ulong)f & 1) != 0) {
      pDVar4 = (DdNode *)((ulong)pDVar4 ^ 1);
      f_02 = (DdNode *)((ulong)f_02 ^ 1);
    }
  }
  g_00 = g;
  g_01 = g;
  if (uVar6 <= uVar7) {
    g_01 = *(DdNode **)(puVar8 + 4);
    g_00 = *(DdNode **)(puVar8 + 6);
    if (((ulong)g & 1) != 0) {
      g_01 = (DdNode *)((ulong)g_01 ^ 1);
      g_00 = (DdNode *)((ulong)g_00 ^ 1);
    }
  }
  f_00 = cuddBddClosestCube(dd,pDVar4,g_01,bound);
  if (f_00 == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  piVar1 = (int *)(((ulong)f_00 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  n = separateCube(dd,f_00,&dtt);
  if (n == (DdNode *)0x0) goto LAB_00622be4;
  piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  Cudd_RecursiveDeref(dd,f_00);
  dVar9 = dtt;
  if (bound <= dtt) {
    dVar9 = bound;
  }
  f_01 = cuddBddClosestCube(dd,f_02,g_00,dVar9);
  f_00 = n;
  if (f_01 == (DdNode *)0x0) goto LAB_00622be4;
  piVar1 = (int *)(((ulong)f_01 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  n_00 = separateCube(dd,f_01,&dee);
  if (n_00 == (DdNode *)0x0) {
LAB_0062283c:
    Cudd_RecursiveDeref(dd,n);
    f_00 = f_01;
  }
  else {
    piVar1 = (int *)(((ulong)n_00 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDeref(dd,f_01);
    dVar10 = dee;
    if (dtt <= dee) {
      dVar10 = dtt;
    }
    dVar11 = dVar9;
    if ((dVar10 <= 2147483647.0) && (dVar11 = dVar10 + -1.0, dVar9 <= dVar10 + -1.0)) {
      dVar11 = dVar9;
    }
    if ((0.0 < dVar10) && (uVar7 == uVar6)) {
      f_00 = cuddBddClosestCube(dd,pDVar4,g_00,dVar11 + -1.0);
      if (f_00 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,n);
        f_00 = n_00;
        goto LAB_00622be4;
      }
      piVar1 = (int *)(((ulong)f_00 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      f_01 = separateCube(dd,f_00,&local_48);
      if (f_01 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)f_01 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,f_00);
        dVar12 = local_48 + 1.0;
        dVar9 = dVar12;
        if (dVar10 <= dVar12) {
          dVar9 = dVar10;
        }
        goto LAB_0062295f;
      }
      Cudd_RecursiveDeref(dd,n);
LAB_00622bd9:
      Cudd_RecursiveDeref(dd,n_00);
      goto LAB_00622be4;
    }
    piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    dVar12 = 2147483648.0;
    f_01 = pDVar2;
    dVar9 = dVar10;
LAB_0062295f:
    dVar10 = dVar11;
    if ((dVar9 <= 2147483647.0) && (dVar10 = dVar9 + -1.0, dVar11 <= dVar9 + -1.0)) {
      dVar10 = dVar11;
    }
    if ((dVar9 <= 0.0) || (uVar7 != uVar6)) {
      piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      local_50 = 2147483648.0;
      dVar10 = dVar9;
      local_c0 = pDVar2;
    }
    else {
      f_00 = cuddBddClosestCube(dd,f_02,g_01,dVar10 + -1.0);
      if (f_00 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,n);
        n = n_00;
        goto LAB_0062283c;
      }
      piVar1 = (int *)(((ulong)f_00 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      local_c0 = separateCube(dd,f_00,&local_50);
      if (local_c0 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,n);
        Cudd_RecursiveDeref(dd,n_00);
        n_00 = f_01;
        goto LAB_00622bd9;
      }
      piVar1 = (int *)(((ulong)local_c0 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(dd,f_00);
      local_50 = local_50 + 1.0;
      dVar10 = local_50;
      if (dVar9 <= local_50) {
        dVar10 = dVar9;
      }
    }
    if ((dVar10 != dtt) || (NAN(dVar10) || NAN(dtt))) {
      if ((dVar10 != dee) || (NAN(dVar10) || NAN(dee))) {
        if ((dVar10 != dVar12) || (NAN(dVar10) || NAN(dVar12))) {
          if (uVar7 != uVar6) {
            __assert_fail("topf == topg",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                          ,0x708,
                          "DdNode *cuddBddClosestCube(DdManager *, DdNode *, DdNode *, double)");
          }
          uVar5 = 0;
          pDVar4 = local_c0;
        }
        else {
          if (uVar7 != uVar6) {
            __assert_fail("topf == topg",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                          ,0x703,
                          "DdNode *cuddBddClosestCube(DdManager *, DdNode *, DdNode *, double)");
          }
          uVar5 = 1;
          pDVar4 = f_01;
          local_50 = dVar12;
        }
      }
      else {
        uVar5 = 0;
        pDVar4 = n_00;
        local_50 = dee;
      }
    }
    else {
      if (n == n_00) {
        if ((dtt == dee) && (!NAN(dtt) && !NAN(dee))) {
          index = 0x7fffffff;
        }
      }
      uVar5 = 1;
      pDVar4 = n;
      local_50 = dtt;
    }
    pDVar4 = createResult(dd,index,uVar5,pDVar4,local_50);
    if (pDVar4 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(dd,n);
      Cudd_RecursiveDeref(dd,n_00);
      Cudd_RecursiveDeref(dd,f_01);
      Cudd_RecursiveDeref(dd,local_c0);
      if (((puVar3[1] != 1) || (puVar8[1] != 1)) && (pDVar4 != pDVar2)) {
        cuddCacheInsert2(dd,Cudd_bddClosestCube,f,g,pDVar4);
      }
      piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
      return pDVar4;
    }
    Cudd_RecursiveDeref(dd,n);
    Cudd_RecursiveDeref(dd,n_00);
    Cudd_RecursiveDeref(dd,f_01);
    f_00 = local_c0;
  }
LAB_00622be4:
  Cudd_RecursiveDeref(dd,f_00);
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddBddClosestCube(
  DdManager *dd,
  DdNode *f,
  DdNode *g,
  CUDD_VALUE_TYPE bound)
{
    DdNode *res, *F, *G, *ft, *fe, *gt, *ge, *tt, *ee;
    DdNode *ctt, *cee, *cte, *cet;
    CUDD_VALUE_TYPE minD, dtt, dee, dte, det;
    DdNode *one = DD_ONE(dd);
    DdNode *lzero = Cudd_Not(one);
    DdNode *azero = DD_ZERO(dd);
    unsigned int topf, topg, index;

    statLine(dd);
    if (bound < (int)(f == Cudd_Not(g))) return(azero);
    /* Terminal cases. */
    if (g == lzero || f == lzero) return(azero);
    if (f == one && g == one) return(one);

    /* Check cache. */
    F = Cudd_Regular(f);
    G = Cudd_Regular(g);
    if (F->ref != 1 || G->ref != 1) {
        res = cuddCacheLookup2(dd,(DD_CTFP) Cudd_bddClosestCube, f, g);
        if (res != NULL) return(res);
    }

    topf = cuddI(dd,F->index);
    topg = cuddI(dd,G->index);

    /* Compute cofactors. */
    if (topf <= topg) {
        index = F->index;
        ft = cuddT(F);
        fe = cuddE(F);
        if (Cudd_IsComplement(f)) {
            ft = Cudd_Not(ft);
            fe = Cudd_Not(fe);
        }
    } else {
        index = G->index;
        ft = fe = f;
    }

    if (topg <= topf) {
        gt = cuddT(G);
        ge = cuddE(G);
        if (Cudd_IsComplement(g)) {
            gt = Cudd_Not(gt);
            ge = Cudd_Not(ge);
        }
    } else {
        gt = ge = g;
    }

    tt = cuddBddClosestCube(dd,ft,gt,bound);
    if (tt == NULL) return(NULL);
    cuddRef(tt);
    ctt = separateCube(dd,tt,&dtt);
    if (ctt == NULL) {
        Cudd_RecursiveDeref(dd, tt);
        return(NULL);
    }
    cuddRef(ctt);
    Cudd_RecursiveDeref(dd, tt);
    minD = dtt;
    bound = ddMin(bound,minD);

    ee = cuddBddClosestCube(dd,fe,ge,bound);
    if (ee == NULL) {
        Cudd_RecursiveDeref(dd, ctt);
        return(NULL);
    }
    cuddRef(ee);
    cee = separateCube(dd,ee,&dee);
    if (cee == NULL) {
        Cudd_RecursiveDeref(dd, ctt);
        Cudd_RecursiveDeref(dd, ee);
        return(NULL);
    }
    cuddRef(cee);
    Cudd_RecursiveDeref(dd, ee);
    minD = ddMin(dtt, dee);
    if (minD <= CUDD_CONST_INDEX) bound = ddMin(bound,minD-1);

    if (minD > 0 && topf == topg) {
        DdNode *te = cuddBddClosestCube(dd,ft,ge,bound-1);
        if (te == NULL) {
            Cudd_RecursiveDeref(dd, ctt);
            Cudd_RecursiveDeref(dd, cee);
            return(NULL);
        }
        cuddRef(te);
        cte = separateCube(dd,te,&dte);
        if (cte == NULL) {
            Cudd_RecursiveDeref(dd, ctt);
            Cudd_RecursiveDeref(dd, cee);
            Cudd_RecursiveDeref(dd, te);
            return(NULL);
        }
        cuddRef(cte);
        Cudd_RecursiveDeref(dd, te);
        dte += 1.0;
        minD = ddMin(minD, dte);
    } else {
        cte = azero;
        cuddRef(cte);
        dte = CUDD_CONST_INDEX + 1.0;
    }
    if (minD <= CUDD_CONST_INDEX) bound = ddMin(bound,minD-1);

    if (minD > 0 && topf == topg) {
        DdNode *et = cuddBddClosestCube(dd,fe,gt,bound-1);
        if (et == NULL) {
            Cudd_RecursiveDeref(dd, ctt);
            Cudd_RecursiveDeref(dd, cee);
            Cudd_RecursiveDeref(dd, cte);
            return(NULL);
        }
        cuddRef(et);
        cet = separateCube(dd,et,&det);
        if (cet == NULL) {
            Cudd_RecursiveDeref(dd, ctt);
            Cudd_RecursiveDeref(dd, cee);
            Cudd_RecursiveDeref(dd, cte);
            Cudd_RecursiveDeref(dd, et);
            return(NULL);
        }
        cuddRef(cet);
        Cudd_RecursiveDeref(dd, et);
        det += 1.0;
        minD = ddMin(minD, det);
    } else {
        cet = azero;
        cuddRef(cet);
        det = CUDD_CONST_INDEX + 1.0;
    }

    if (minD == dtt) {
        if (dtt == dee && ctt == cee) {
            res = createResult(dd,CUDD_CONST_INDEX,1,ctt,dtt);
        } else {
            res = createResult(dd,index,1,ctt,dtt);
        }
    } else if (minD == dee) {
        res = createResult(dd,index,0,cee,dee);
    } else if (minD == dte) {
#ifdef DD_DEBUG
        assert(topf == topg);
#endif
        res = createResult(dd,index,1,cte,dte);
    } else {
#ifdef DD_DEBUG
        assert(topf == topg);
#endif
        res = createResult(dd,index,0,cet,det);
    }
    if (res == NULL) {
        Cudd_RecursiveDeref(dd, ctt);
        Cudd_RecursiveDeref(dd, cee);
        Cudd_RecursiveDeref(dd, cte);
        Cudd_RecursiveDeref(dd, cet);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(dd, ctt);
    Cudd_RecursiveDeref(dd, cee);
    Cudd_RecursiveDeref(dd, cte);
    Cudd_RecursiveDeref(dd, cet);

    /* Only cache results that are different from azero to avoid
    ** storing results that depend on the value of the bound. */
    if ((F->ref != 1 || G->ref != 1) && res != azero)
        cuddCacheInsert2(dd,(DD_CTFP) Cudd_bddClosestCube, f, g, res);

    cuddDeref(res);
    return(res);

}